

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRenderingBoundaryCondition.cpp
# Opt level: O1

char * __thiscall
glcts::GeometryShaderLayeredRenderingBoundaryCondition::getFragmentShaderCode
          (GeometryShaderLayeredRenderingBoundaryCondition *this)

{
  return 
  "${VERSION}\n\nprecision highp float;\n\nflat in  int  layer_id;\n     out vec4 color;\n\nvoid main()\n{\n    color = vec4(1, 1, 1, 1);\n}\n"
  ;
}

Assistant:

const char* GeometryShaderLayeredRenderingBoundaryCondition::getFragmentShaderCode()
{
	static const char* result = "${VERSION}\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"flat in  int  layer_id;\n"
								"     out vec4 color;\n"
								"\n"
								"void main()\n"
								"{\n"
								"    color = vec4(1, 1, 1, 1);\n"
								"}\n";
	return result;
}